

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

SmallBuffer * getBuffer(HelicsDataBuffer data)

{
  Message *pMVar1;
  SmallBuffer *in_RDI;
  Message *message;
  SmallBuffer *ptr;
  HelicsError *in_stack_ffffffffffffffe0;
  SmallBuffer *local_8;
  
  if ((in_RDI == (SmallBuffer *)0x0) || (local_8 = in_RDI, in_RDI->userKey != 0x24ea663f)) {
    pMVar1 = getMessageObj(in_RDI,in_stack_ffffffffffffffe0);
    if (pMVar1 == (Message *)0x0) {
      local_8 = (SmallBuffer *)0x0;
    }
    else {
      local_8 = &pMVar1->data;
    }
  }
  return local_8;
}

Assistant:

helics::SmallBuffer* getBuffer(HelicsDataBuffer data)
{
    auto* ptr = reinterpret_cast<helics::SmallBuffer*>(data);
    if (ptr != nullptr && ptr->userKey == gBufferValidationIdentifier) {
        return ptr;
    }
    auto* message = getMessageObj(data, nullptr);
    if (message != nullptr) {
        return &message->data;
    }
    return nullptr;
}